

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

int mbedtls_ecp_gen_keypair_base
              (mbedtls_ecp_group *grp,mbedtls_ecp_point *G,mbedtls_mpi *d,mbedtls_ecp_point *Q,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  size_t sVar2;
  size_t count;
  int iVar3;
  ulong uVar4;
  ulong size;
  
  if ((grp->G).X.p == (mbedtls_mpi_uint *)0x0) {
    iVar1 = -0x4f80;
  }
  else {
    uVar4 = grp->nbits + 7;
    size = uVar4 >> 3;
    if ((grp->G).Y.p == (mbedtls_mpi_uint *)0x0) {
      do {
        iVar1 = mbedtls_mpi_fill_random(d,size,f_rng,p_rng);
        if (iVar1 != 0) {
          return iVar1;
        }
        sVar2 = mbedtls_mpi_bitlen(d);
      } while (sVar2 == 0);
      sVar2 = mbedtls_mpi_bitlen(d);
      uVar4 = grp->nbits;
      count = (sVar2 - 1) - uVar4;
      if (sVar2 - 1 < uVar4 || count == 0) {
        iVar1 = mbedtls_mpi_set_bit(d,uVar4,'\x01');
      }
      else {
        iVar1 = mbedtls_mpi_shift_r(d,count);
      }
      if ((((iVar1 == 0) && (iVar1 = mbedtls_mpi_set_bit(d,0,'\0'), iVar1 == 0)) &&
          (iVar1 = mbedtls_mpi_set_bit(d,1,'\0'), iVar1 == 0)) &&
         ((grp->nbits != 0xfe || (iVar1 = mbedtls_mpi_set_bit(d,2,'\0'), iVar1 == 0)))) {
LAB_00109d3c:
        iVar1 = mbedtls_ecp_mul(grp,Q,d,G,f_rng,p_rng);
        return iVar1;
      }
    }
    else {
      iVar1 = mbedtls_mpi_fill_random(d,size,f_rng,p_rng);
      if (iVar1 == 0) {
        iVar3 = 0x1f;
        do {
          iVar1 = mbedtls_mpi_shift_r(d,(uVar4 & 0xfffffffffffffff8) - grp->nbits);
          if (iVar1 != 0) {
            return iVar1;
          }
          iVar3 = iVar3 + -1;
          if (iVar3 == 0) {
            return -0x4d00;
          }
          iVar1 = mbedtls_mpi_cmp_int(d,1);
          if ((-1 < iVar1) && (iVar1 = mbedtls_mpi_cmp_mpi(d,&grp->N), iVar1 < 0))
          goto LAB_00109d3c;
          iVar1 = mbedtls_mpi_fill_random(d,size,f_rng,p_rng);
        } while (iVar1 == 0);
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_ecp_gen_keypair_base( mbedtls_ecp_group *grp,
                     const mbedtls_ecp_point *G,
                     mbedtls_mpi *d, mbedtls_ecp_point *Q,
                     int (*f_rng)(void *, unsigned char *, size_t),
                     void *p_rng )
{
    int ret;
    size_t n_size = ( grp->nbits + 7 ) / 8;

#if defined(ECP_MONTGOMERY)
    if( ecp_get_type( grp ) == ECP_TYPE_MONTGOMERY )
    {
        /* [M225] page 5 */
        size_t b;

        do {
            MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( d, n_size, f_rng, p_rng ) );
        } while( mbedtls_mpi_bitlen( d ) == 0);

        /* Make sure the most significant bit is nbits */
        b = mbedtls_mpi_bitlen( d ) - 1; /* mbedtls_mpi_bitlen is one-based */
        if( b > grp->nbits )
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( d, b - grp->nbits ) );
        else
            MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, grp->nbits, 1 ) );

        /* Make sure the last two bits are unset for Curve448, three bits for
           Curve25519 */
        MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, 0, 0 ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, 1, 0 ) );
        if( grp->nbits == 254 )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_set_bit( d, 2, 0 ) );
        }
    }
    else
#endif /* ECP_MONTGOMERY */
#if defined(ECP_SHORTWEIERSTRASS)
    if( ecp_get_type( grp ) == ECP_TYPE_SHORT_WEIERSTRASS )
    {
        /* SEC1 3.2.1: Generate d such that 1 <= n < N */
        int count = 0;

        /*
         * Match the procedure given in RFC 6979 (deterministic ECDSA):
         * - use the same byte ordering;
         * - keep the leftmost nbits bits of the generated octet string;
         * - try until result is in the desired range.
         * This also avoids any biais, which is especially important for ECDSA.
         */
        do
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_fill_random( d, n_size, f_rng, p_rng ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_shift_r( d, 8 * n_size - grp->nbits ) );

            /*
             * Each try has at worst a probability 1/2 of failing (the msb has
             * a probability 1/2 of being 0, and then the result will be < N),
             * so after 30 tries failure probability is a most 2**(-30).
             *
             * For most curves, 1 try is enough with overwhelming probability,
             * since N starts with a lot of 1s in binary, but some curves
             * such as secp224k1 are actually very close to the worst case.
             */
            if( ++count > 30 )
                return( MBEDTLS_ERR_ECP_RANDOM_FAILED );
        }
        while( mbedtls_mpi_cmp_int( d, 1 ) < 0 ||
               mbedtls_mpi_cmp_mpi( d, &grp->N ) >= 0 );
    }
    else
#endif /* ECP_SHORTWEIERSTRASS */
        return( MBEDTLS_ERR_ECP_BAD_INPUT_DATA );

cleanup:
    if( ret != 0 )
        return( ret );

    return( mbedtls_ecp_mul( grp, Q, d, G, f_rng, p_rng ) );
}